

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

N_Vector * N_VCloneVectorArray(int count,N_Vector w)

{
  N_Vector *pp_Var1;
  N_Vector p_Var2;
  ulong uVar3;
  
  if (0 < count) {
    pp_Var1 = (N_Vector *)malloc((ulong)(uint)count * 8);
    if (pp_Var1 != (N_Vector *)0x0) {
      for (uVar3 = 0; (uint)count != uVar3; uVar3 = uVar3 + 1) {
        p_Var2 = (*w->ops->nvclone)(w);
        p_Var2->sunctx = w->sunctx;
        pp_Var1[uVar3] = p_Var2;
      }
      return pp_Var1;
    }
  }
  return (N_Vector *)0x0;
}

Assistant:

N_Vector* N_VCloneVectorArray(int count, N_Vector w)
{
  N_Vector* vs = NULL;
  int j;

  if (count <= 0) return(NULL);

  vs = (N_Vector* ) malloc(count * sizeof(N_Vector));
  if (vs == NULL) return(NULL);

  for (j = 0; j < count; j++) {
    vs[j] = N_VClone(w);
    if (vs[j] == NULL) {
      N_VDestroyVectorArray(vs, j-1);
      return(NULL);
    }
  }

  return(vs);
}